

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.c
# Opt level: O0

axbStatus_t axbOpBackendSetName(axbOpBackend_s *ops,char *name)

{
  size_t sVar1;
  char *pcVar2;
  ulong local_30;
  size_t i;
  size_t len;
  char *name_local;
  axbOpBackend_s *ops_local;
  
  sVar1 = strlen(name);
  if (ops->name == (char *)0x0) {
    ops->name_capacity = sVar1 + 2;
    pcVar2 = (char *)malloc(ops->name_capacity);
    ops->name = pcVar2;
  }
  if (sVar1 < 9) {
    for (local_30 = 0; local_30 <= sVar1; local_30 = local_30 + 1) {
      ops->name[local_30] = name[local_30];
    }
    ops_local._4_4_ = 0;
  }
  else {
    ops_local._4_4_ = 0x2619;
  }
  return ops_local._4_4_;
}

Assistant:

axbStatus_t axbOpBackendSetName(struct axbOpBackend_s *ops, const char *name)
{
  size_t len = strlen(name);
  if (!ops->name)
  {
    ops->name_capacity = len + 2;
    ops->name = malloc(ops->name_capacity);
  }

  if (len > sizeof(ops->name)) return 9753;  // op name too large
  for (size_t i=0; i<=len; ++i) ops->name[i] = name[i];

  return 0;
}